

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::expand
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this)

{
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  
  sVar5 = 8;
  if (this->_capacity != 0) {
    sVar5 = this->_capacity * 2;
  }
  pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)Lib::alloc(sVar5 * 0x20);
  uVar4 = this->_capacity;
  if (uVar4 == 0) {
    sVar2 = 0;
  }
  else {
    lVar6 = 0;
    for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
                ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 ((long)&(pMVar1->numeral)._val[0]._mp_alloc + lVar6),
                 (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 ((long)&(this->_stack->numeral)._val[0]._mp_alloc + lVar6));
      Kernel::IntegerConstantType::~IntegerConstantType
                ((IntegerConstantType *)((long)&(this->_stack->numeral)._val[0]._mp_alloc + lVar6));
      uVar4 = this->_capacity;
      lVar6 = lVar6 + 0x20;
    }
    Lib::free(this->_stack);
    sVar2 = this->_capacity;
  }
  this->_stack = pMVar1;
  this->_cursor = pMVar1 + sVar2;
  this->_end = pMVar1 + sVar5;
  this->_capacity = sVar5;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }